

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_access_block_grid_idx(Integer g_a,Integer *subscript,AccessIndex *index,Integer *ld)

{
  short sVar1;
  long icode;
  Integer IVar2;
  DoubleComplex **ppDVar3;
  sbyte sVar4;
  ulong uVar5;
  long lVar6;
  DoubleComplex *pDVar7;
  ulong uVar8;
  char *ptr;
  ulong local_50;
  long local_48;
  long local_40;
  Integer *local_38;
  
  local_48 = g_a + 1000;
  local_40 = local_48 * 0x368;
  sVar1 = GA[local_48].ndim;
  local_38 = ld;
  if (0 < (long)sVar1) {
    lVar6 = 0;
    do {
      icode = subscript[lVar6];
      if ((icode < 0) || (GA[g_a + 1000].num_blocks[lVar6] <= icode)) {
        pnga_error("index outside allowed values",icode);
      }
      lVar6 = lVar6 + 1;
    } while (sVar1 != lVar6);
  }
  pnga_access_block_grid_ptr(g_a,subscript,&local_50,local_38);
  uVar8 = (ulong)*(int *)((long)GA->dims + local_40 + -0x18);
  IVar2 = pnga_type_c2f((long)*(int *)((long)GA->dims + local_40 + -0x2c));
  pDVar7 = (DoubleComplex *)0x0;
  sVar4 = 3;
  switch(IVar2) {
  case 0x3f2:
    ppDVar3 = (DoubleComplex **)&INT_MB;
    break;
  default:
    goto switchD_0016d747_caseD_3f3;
  case 0x3f4:
    sVar4 = 2;
    ppDVar3 = (DoubleComplex **)&FLT_MB;
    break;
  case 0x3f5:
    ppDVar3 = (DoubleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppDVar3 = (DoubleComplex **)&SCPL_MB;
    break;
  case 0x3f7:
    sVar4 = 4;
    ppDVar3 = &DCPL_MB;
  }
  pDVar7 = *ppDVar3;
  *index = (long)(local_50 - (long)pDVar7) >> sVar4;
switchD_0016d747_caseD_3f3:
  uVar5 = local_50 % uVar8;
  uVar8 = (ulong)pDVar7 % uVar8;
  if (uVar5 != uVar8) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,local_50,uVar5,pDVar7,uVar8);
    pnga_error("nga_access: MA addressing problem: base address misallignment",local_48);
  }
  *index = *index + 1;
  return;
}

Assistant:

void pnga_access_block_grid_idx(Integer g_a, Integer* subscript,
                                AccessIndex *index, Integer *ld)
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i,ndim/*,p_handle*/;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   /*p_handle = GA[handle].p_handle;*/
   ndim = GA[handle].ndim;
   for (i=0; i<ndim; i++) 
     if (subscript[i]<0 || subscript[i] >= GA[handle].num_blocks[i]) 
       pnga_error("index outside allowed values",subscript[i]);

   pnga_access_block_grid_ptr(g_a,subscript,&ptr,ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}